

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidgetitemiterator.cpp
# Opt level: O2

void __thiscall
QTreeWidgetItemIterator::QTreeWidgetItemIterator
          (QTreeWidgetItemIterator *this,QTreeWidgetItem *item,IteratorFlags flags)

{
  QTreeWidgetItem *pQVar1;
  bool bVar2;
  int iVar3;
  QTreeWidgetItemIteratorPrivate *pQVar4;
  QAbstractItemModel *pQVar5;
  QTreeModel *pQVar6;
  QTreeWidgetItem *pQVar7;
  QTreeWidgetItem *this_00;
  QTreeWidgetItem *itm;
  QTreeWidgetItem *achild;
  
  pQVar4 = (QTreeWidgetItemIteratorPrivate *)operator_new(0x30);
  pQVar5 = QAbstractItemView::model((QAbstractItemView *)item->view);
  pQVar6 = QtPrivate::qobject_cast_helper<QTreeModel*,QObject>((QObject *)pQVar5);
  pQVar4->m_currentIndex = 0;
  pQVar4->m_model = pQVar6;
  (pQVar4->m_parentIndex).super_QList<int>.d.d = (Data *)0x0;
  (pQVar4->m_parentIndex).super_QList<int>.d.ptr = (int *)0x0;
  (pQVar4->m_parentIndex).super_QList<int>.d.size = 0;
  pQVar4->q_ptr = this;
  (this->d_ptr).d = pQVar4;
  this->current = item;
  (this->flags).super_QFlagsStorageHelper<QTreeWidgetItemIterator::IteratorFlag,_4>.
  super_QFlagsStorage<QTreeWidgetItemIterator::IteratorFlag>.i =
       (Int)flags.super_QFlagsStorageHelper<QTreeWidgetItemIterator::IteratorFlag,_4>.
            super_QFlagsStorage<QTreeWidgetItemIterator::IteratorFlag>.i;
  pQVar5 = QAbstractItemView::model((QAbstractItemView *)item->view);
  pQVar6 = QtPrivate::qobject_cast_helper<QTreeModel*,QObject>((QObject *)pQVar5);
  QList<QTreeWidgetItemIterator_*>::append(&pQVar6->iterators,this);
  achild = item->par;
  pQVar1 = pQVar4->m_model->rootItem;
  pQVar7 = achild;
  if (achild == (QTreeWidgetItem *)0x0) {
    pQVar7 = pQVar1;
  }
  iVar3 = QTreeWidgetItem::indexOfChild(pQVar7,item);
  pQVar4->m_currentIndex = iVar3;
  while (achild != (QTreeWidgetItem *)0x0) {
    pQVar7 = achild->par;
    this_00 = pQVar7;
    if (pQVar7 == (QTreeWidgetItem *)0x0) {
      this_00 = pQVar1;
    }
    iVar3 = QTreeWidgetItem::indexOfChild(this_00,achild);
    QList<int>::prepend(&(pQVar4->m_parentIndex).super_QList<int>,iVar3);
    achild = pQVar7;
  }
  if (this->current != (QTreeWidgetItem *)0x0) {
    bVar2 = matchesFlags(this,this->current);
    if (!bVar2) {
      operator++(this);
      return;
    }
  }
  return;
}

Assistant:

QTreeWidgetItemIterator::QTreeWidgetItemIterator(QTreeWidgetItem *item, IteratorFlags flags)
    : d_ptr(new QTreeWidgetItemIteratorPrivate(
                this, qobject_cast<QTreeModel*>(item->view->model()))),
      current(item), flags(flags)
{
    Q_D(QTreeWidgetItemIterator);
    Q_ASSERT(item);
    QTreeModel *model = qobject_cast<QTreeModel*>(item->view->model());
    Q_ASSERT(model);
    model->iterators.append(this);

    // Initialize m_currentIndex and m_parentIndex as it would be if we had traversed from
    // the beginning.
    QTreeWidgetItem *parent = item;
    parent = parent->parent();
    QTreeWidgetItem *root = d->m_model->rootItem;
    d->m_currentIndex = (parent ? parent : root)->indexOfChild(item);

    while (parent) {
        QTreeWidgetItem *itm = parent;
        parent = parent->parent();
        const int index = (parent ? parent : root)->indexOfChild(itm);
        d->m_parentIndex.prepend(index);
    }

    if (current && !matchesFlags(current))
        ++(*this);
}